

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

bool __thiscall
spirv_cross::Compiler::ActiveBuiltinHandler::handle
          (ActiveBuiltinHandler *this,Op opcode,uint32_t *args,uint32_t length)

{
  ID *__k;
  StorageClass SVar1;
  uint uVar2;
  Compiler *pCVar3;
  Decoration *pDVar4;
  SPIRVariable *var;
  SPIRType *pSVar5;
  SPIRConstant *pSVar6;
  mapped_type *pmVar7;
  SPIRType *type;
  uint32_t i;
  ulong uVar8;
  bool bVar9;
  TypeID *pTVar10;
  
  bVar9 = true;
  switch(opcode) {
  case OpFunctionCall:
    if (2 < length) {
      for (uVar8 = 0; length - 3 != uVar8; uVar8 = uVar8 + 1) {
        add_if_builtin(this,args[uVar8 + 3]);
      }
      return true;
    }
    break;
  case OpFunctionEnd|OpSourceContinued:
  case OpVariable:
  case OpImageTexelPointer:
  case OpCopyMemorySized:
    goto switchD_003783a2_caseD_3a;
  case OpLoad:
switchD_003783a2_caseD_3d:
    if (2 < length) {
      args = args + 2;
LAB_003785c2:
      add_if_builtin(this,*args);
      return true;
    }
    break;
  case OpStore:
    if (length != 0) goto LAB_003785c2;
    break;
  case OpCopyMemory:
    if (1 < length) {
      add_if_builtin(this,*args);
      args = args + 1;
      goto LAB_003785c2;
    }
    break;
  case OpAccessChain:
  case OpInBoundsAccessChain:
  case OpPtrAccessChain:
    if (3 < length) {
      var = maybe_get<spirv_cross::SPIRVariable>(this->compiler,args[2]);
      if (var == (SPIRVariable *)0x0) {
        return true;
      }
      add_if_builtin(this,args[2]);
      pSVar5 = get_variable_data_type(this->compiler,var);
      SVar1 = var->storage;
      pCVar3 = this->compiler;
      uVar8 = 0;
      do {
        if (length - 3 == uVar8) {
          return true;
        }
        if ((uVar8 == 0 && opcode == OpPtrAccessChain) ||
           ((pSVar5->array).super_VectorView<unsigned_int>.buffer_size != 0)) {
          pTVar10 = &pSVar5->parent_type;
        }
        else {
          if (*(int *)&(pSVar5->super_IVariant).field_0xc != 0xf) {
            return true;
          }
          pSVar6 = get<spirv_cross::SPIRConstant>(this->compiler,args[uVar8 + 3]);
          uVar2 = (pSVar6->m).c[0].r[0].u32;
          __k = &(pSVar5->super_IVariant).self;
          pmVar7 = ::std::__detail::
                   _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&(this->compiler->ir).meta,__k);
          if (uVar2 < (uint)(pmVar7->members).super_VectorView<spirv_cross::Meta::Decoration>.
                            buffer_size) {
            pmVar7 = ::std::__detail::
                     _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)&(this->compiler->ir).meta,__k);
            pDVar4 = (pmVar7->members).super_VectorView<spirv_cross::Meta::Decoration>.ptr;
            if (pDVar4[uVar2].builtin == true) {
              Bitset::set(&pCVar3->active_input_builtins + (SVar1 != StorageClassInput),
                          pDVar4[uVar2].builtin_type);
              type = get<spirv_cross::SPIRType>
                               (this->compiler,
                                (pSVar5->member_types).
                                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                                [uVar2].id);
              handle_builtin(this,type,pDVar4[uVar2].builtin_type,&pDVar4[uVar2].decoration_flags);
            }
          }
          pTVar10 = (pSVar5->member_types).
                    super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr + uVar2;
        }
        pSVar5 = get<spirv_cross::SPIRType>(this->compiler,pTVar10->id);
        uVar8 = uVar8 + 1;
      } while( true );
    }
    break;
  default:
    if (opcode == OpCopyObject) goto switchD_003783a2_caseD_3d;
    if (opcode == OpSelect) {
      if (4 < length) {
        add_if_builtin(this,args[3]);
        args = args + 4;
        goto LAB_003785c2;
      }
    }
    else {
      if (opcode != OpPhi) {
        return true;
      }
      if (1 < length) {
        for (uVar8 = 0; uVar8 < length - 2; uVar8 = uVar8 + 2) {
          add_if_builtin(this,args[uVar8 + 2]);
        }
        return true;
      }
    }
  }
  bVar9 = false;
switchD_003783a2_caseD_3a:
  return bVar9;
}

Assistant:

bool Compiler::ActiveBuiltinHandler::handle(spv::Op opcode, const uint32_t *args, uint32_t length)
{
	switch (opcode)
	{
	case OpStore:
		if (length < 1)
			return false;

		add_if_builtin(args[0]);
		break;

	case OpCopyMemory:
		if (length < 2)
			return false;

		add_if_builtin(args[0]);
		add_if_builtin(args[1]);
		break;

	case OpCopyObject:
	case OpLoad:
		if (length < 3)
			return false;

		add_if_builtin(args[2]);
		break;

	case OpSelect:
		if (length < 5)
			return false;

		add_if_builtin(args[3]);
		add_if_builtin(args[4]);
		break;

	case OpPhi:
	{
		if (length < 2)
			return false;

		uint32_t count = length - 2;
		args += 2;
		for (uint32_t i = 0; i < count; i += 2)
			add_if_builtin(args[i]);
		break;
	}

	case OpFunctionCall:
	{
		if (length < 3)
			return false;

		uint32_t count = length - 3;
		args += 3;
		for (uint32_t i = 0; i < count; i++)
			add_if_builtin(args[i]);
		break;
	}

	case OpAccessChain:
	case OpInBoundsAccessChain:
	case OpPtrAccessChain:
	{
		if (length < 4)
			return false;

		// Only consider global variables, cannot consider variables in functions yet, or other
		// access chains as they have not been created yet.
		auto *var = compiler.maybe_get<SPIRVariable>(args[2]);
		if (!var)
			break;

		// Required if we access chain into builtins like gl_GlobalInvocationID.
		add_if_builtin(args[2]);

		// Start traversing type hierarchy at the proper non-pointer types.
		auto *type = &compiler.get_variable_data_type(*var);

		auto &flags =
		    var->storage == StorageClassInput ? compiler.active_input_builtins : compiler.active_output_builtins;

		uint32_t count = length - 3;
		args += 3;
		for (uint32_t i = 0; i < count; i++)
		{
			// Pointers
			if (opcode == OpPtrAccessChain && i == 0)
			{
				type = &compiler.get<SPIRType>(type->parent_type);
				continue;
			}

			// Arrays
			if (!type->array.empty())
			{
				type = &compiler.get<SPIRType>(type->parent_type);
			}
			// Structs
			else if (type->basetype == SPIRType::Struct)
			{
				uint32_t index = compiler.get<SPIRConstant>(args[i]).scalar();

				if (index < uint32_t(compiler.ir.meta[type->self].members.size()))
				{
					auto &decorations = compiler.ir.meta[type->self].members[index];
					if (decorations.builtin)
					{
						flags.set(decorations.builtin_type);
						handle_builtin(compiler.get<SPIRType>(type->member_types[index]), decorations.builtin_type,
						               decorations.decoration_flags);
					}
				}

				type = &compiler.get<SPIRType>(type->member_types[index]);
			}
			else
			{
				// No point in traversing further. We won't find any extra builtins.
				break;
			}
		}
		break;
	}

	default:
		break;
	}

	return true;
}